

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_BEGIN(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchChar(G,0x3c);
  if ((iVar3 == 0) || (iVar3 = yy__(G), iVar3 == 0)) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_BEGIN(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "BEGIN"));
  if (!yymatchChar(G, '<')) goto l35;
  if (!yy__(G))  goto l35;
  yyprintf((stderr, "  ok   BEGIN"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l35:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "BEGIN"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}